

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O2

void __thiscall
CEAngle::SetAngle_HmsVect(CEAngle *this,vector<double,_std::allocator<double>_> *angle)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  invalid_value *piVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  double extraout_XMM0_Qa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  double local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  double ang;
  string msg;
  
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](angle,0);
  dVar1 = *pvVar3;
  ang = 0.0;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(angle);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](angle,2);
  local_98 = *pvVar3;
  if (sVar4 == 4) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](angle,3);
    local_98 = local_98 + *pvVar3;
  }
  pvVar6 = angle;
  std::vector<double,_std::allocator<double>_>::operator[](angle,0);
  std::abs((int)pvVar6);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](angle,1);
  iVar2 = iauTf2a(local_98,(dVar1 < 0.0) * '\x02' + '+',(int)extraout_XMM0_Qa,(int)*pvVar3,&ang);
  if (iVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&msg,"[ERROR] ",(allocator *)&bStack_b8);
    __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&bStack_b8);
    if (iVar2 == 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](angle,0);
      std::__cxx11::to_string(&local_70,*pvVar3);
      std::operator+(&local_90,"Hour value \'",&local_70);
      std::operator+(&bStack_b8,&local_90,"\' not in range 0-23");
      std::__cxx11::string::operator+=((string *)&msg,(string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      piVar5 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&bStack_b8,"CEAngle::SetAngle_HmsVect",(allocator *)&local_90);
      CEException::invalid_value::invalid_value(piVar5,&bStack_b8,&msg);
      __cxa_throw(piVar5,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    if (iVar2 == 2) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](angle,1);
      std::__cxx11::to_string(&local_70,*pvVar3);
      std::operator+(&local_90,"Minutes value \'",&local_70);
      std::operator+(&bStack_b8,&local_90,"\' not in range 0-59");
      std::__cxx11::string::operator+=((string *)&msg,(string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      piVar5 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&bStack_b8,"CEAngle::SetAngle_HmsVect",(allocator *)&local_90);
      CEException::invalid_value::invalid_value(piVar5,&bStack_b8,&msg);
      __cxa_throw(piVar5,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    if (iVar2 == 3) {
      std::__cxx11::to_string(&local_70,local_98);
      std::operator+(&local_90,"Seconds value \'",&local_70);
      std::operator+(&bStack_b8,&local_90,"\' not in range 0-59.999...");
      std::__cxx11::string::operator+=((string *)&msg,(string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&bStack_b8);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      piVar5 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&bStack_b8,"CEAngle::SetAngle_HmsVect",(allocator *)&local_90);
      CEException::invalid_value::invalid_value(piVar5,&bStack_b8,&msg);
      __cxa_throw(piVar5,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  msg._M_dataplus._M_p._0_4_ = 1;
  SetAngle(this,&ang,(CEAngleType *)&msg);
  return;
}

Assistant:

void CEAngle::SetAngle_HmsVect(const std::vector<double>& angle)
{
    // Get the angle sign
    char pm = (angle[0] >= 0.0) ? '+' : '-';

    // Do the conversion
    double ang(0.0);
    double sec = (angle.size() == 4) ? angle[2]+angle[3] : angle[2];
    int err = iauTf2a(pm, std::abs(angle[0]), int(angle[1]), sec, &ang);

    // Handle the error
    if (err) {
        std::string msg = "[ERROR] ";
        switch(err) {
            // Hours out of bounds
            case 1:
                msg += "Hour value \'" + std::to_string(angle[0]) + "\' not in range 0-23";
                throw CEException::invalid_value("CEAngle::SetAngle_HmsVect", msg);
            // Minutes out of bounds
            case 2:
                msg += "Minutes value \'" + std::to_string(angle[1]) + "\' not in range 0-59";
                throw CEException::invalid_value("CEAngle::SetAngle_HmsVect", msg);
            // Seconds out of bounds
            case 3:
                msg += "Seconds value \'" + std::to_string(sec) + "\' not in range 0-59.999...";
                throw CEException::invalid_value("CEAngle::SetAngle_HmsVect", msg);
        }
    }

    // Set the angle
    SetAngle(ang, CEAngleType::RADIANS);
    return;
}